

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O3

uint8_t gb_read_mbc_3(MemoryBankController *mc,uint16_t address)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  
  uVar4 = (uint)CONCAT62(in_register_00000032,address);
  if (uVar4 < 0x4000) {
    puVar2 = mc->rom;
    uVar3 = (ulong)address;
  }
  else {
    if ((short)address < 0) {
      if ((uVar4 & 0xe000) == 0xa000) {
        if (mc->ram_enabled == true) {
          if (mc->banking_mode == Banking_Mode_ROM) {
            uVar1 = 0;
          }
          else {
            uVar1 = (uint)mc->banking_register_2;
          }
          return mc->ram[(uVar1 & mc->ram_bank_mask) << 0xd | uVar4 - 0xa000];
        }
      }
      else {
        uVar3 = (ulong)(address - 0xff00);
        if (0x20 < address - 0xff00) {
LAB_001023a9:
          return mc->memory[address];
        }
        if ((0x129000002U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 != 0) {
            if (uVar3 == 0xf) {
              return mc->memory[0xff0f] | 0xe0;
            }
            goto LAB_001023a9;
          }
          if ((mc->memory[0xff00] & 0x20) == 0) {
            return mc->buttons >> 4;
          }
          if ((mc->memory[0xff00] & 0x10) == 0) {
            return mc->buttons;
          }
        }
      }
      return 0xff;
    }
    uVar3 = (ulong)((((uint)mc->banking_register_1 | (uint)mc->banking_register_2 << 5) &
                    mc->rom_bank_mask) << 0xe) + (ulong)(uVar4 - 0x4000);
    puVar2 = mc->rom;
  }
  return puVar2[uVar3];
}

Assistant:

uint8_t gb_read_mbc_3(MemoryBankController* mc, uint16_t address) {

    if(address <= 0x3FFF) {
        return mc->rom[address];
    }

    if(address >= 0x4000 && address <= 0x7FFF) {
        int offset = address - ROM_BANK_SIZE;
        int effective_bank = ((mc->banking_register_2 << 5) | (mc->banking_register_1));
        int read_addr = offset + (effective_bank & mc->rom_bank_mask) * ROM_BANK_SIZE;
        return mc->rom[read_addr];
    }
    
    if (address >= 0xA000 && address <= 0xBFFF) {
        if (mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_mode == Banking_Mode_ROM ? 0 : (mc->banking_register_2);
            int read_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            return mc->ram[read_addr];
        }
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}